

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

BZFILE * BZ2_bzWriteOpen(int *bzerror,FILE *f,int blockSize100k,int verbosity,int workFactor)

{
  int iVar1;
  bzFile *bzf;
  Int32 ret;
  int workFactor_local;
  int verbosity_local;
  int blockSize100k_local;
  FILE *f_local;
  int *bzerror_local;
  
  if (bzerror != (int *)0x0) {
    *bzerror = 0;
  }
  if ((((f == (FILE *)0x0) || (blockSize100k < 1)) || (9 < blockSize100k)) ||
     (((workFactor < 0 || (0xfa < workFactor)) || ((verbosity < 0 || (4 < verbosity)))))) {
    if (bzerror != (int *)0x0) {
      *bzerror = -2;
    }
    bzerror_local = (int *)0x0;
  }
  else {
    iVar1 = ferror((FILE *)f);
    if (iVar1 == 0) {
      bzerror_local = (int *)malloc(0x13f0);
      if (bzerror_local == (int *)0x0) {
        if (bzerror != (int *)0x0) {
          *bzerror = -3;
        }
        bzerror_local = (int *)0x0;
      }
      else {
        if (bzerror != (int *)0x0) {
          *bzerror = 0;
        }
        if (bzerror_local != (int *)0x0) {
          bzerror_local[0x4fa] = 0;
        }
        *(undefined1 *)(bzerror_local + 0x4fb) = 0;
        bzerror_local[0x4e4] = 0;
        *(FILE **)bzerror_local = f;
        *(undefined1 *)(bzerror_local + 0x4e5) = 1;
        bzerror_local[0x4f4] = 0;
        bzerror_local[0x4f5] = 0;
        bzerror_local[0x4f6] = 0;
        bzerror_local[0x4f7] = 0;
        bzerror_local[0x4f8] = 0;
        bzerror_local[0x4f9] = 0;
        bzf._4_4_ = workFactor;
        if (workFactor == 0) {
          bzf._4_4_ = 0x1e;
        }
        iVar1 = BZ2_bzCompressInit((bz_stream *)(bzerror_local + 0x4e6),blockSize100k,verbosity,
                                   bzf._4_4_);
        if (iVar1 == 0) {
          bzerror_local[0x4e8] = 0;
          *(undefined1 *)(bzerror_local + 0x4fb) = 1;
        }
        else {
          if (bzerror != (int *)0x0) {
            *bzerror = iVar1;
          }
          if (bzerror_local != (int *)0x0) {
            bzerror_local[0x4fa] = iVar1;
          }
          free(bzerror_local);
          bzerror_local = (int *)0x0;
        }
      }
    }
    else {
      if (bzerror != (int *)0x0) {
        *bzerror = -6;
      }
      bzerror_local = (int *)0x0;
    }
  }
  return bzerror_local;
}

Assistant:

BZFILE* BZ_API(BZ2_bzWriteOpen) 
                    ( int*  bzerror,      
                      FILE* f, 
                      int   blockSize100k, 
                      int   verbosity,
                      int   workFactor )
{
   Int32   ret;
   bzFile* bzf = NULL;

   BZ_SETERR(BZ_OK);

   if (f == NULL ||
       (blockSize100k < 1 || blockSize100k > 9) ||
       (workFactor < 0 || workFactor > 250) ||
       (verbosity < 0 || verbosity > 4))
      { BZ_SETERR(BZ_PARAM_ERROR); return NULL; };

   if (ferror(f))
      { BZ_SETERR(BZ_IO_ERROR); return NULL; };

   bzf = malloc ( sizeof(bzFile) );
   if (bzf == NULL)
      { BZ_SETERR(BZ_MEM_ERROR); return NULL; };

   BZ_SETERR(BZ_OK);
   bzf->initialisedOk = False;
   bzf->bufN          = 0;
   bzf->handle        = f;
   bzf->writing       = True;
   bzf->strm.bzalloc  = NULL;
   bzf->strm.bzfree   = NULL;
   bzf->strm.opaque   = NULL;

   if (workFactor == 0) workFactor = 30;
   ret = BZ2_bzCompressInit ( &(bzf->strm), blockSize100k, 
                              verbosity, workFactor );
   if (ret != BZ_OK)
      { BZ_SETERR(ret); free(bzf); return NULL; };

   bzf->strm.avail_in = 0;
   bzf->initialisedOk = True;
   return bzf;   
}